

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int openDatabase(char *zFilename,sqlite3 **ppDb,uint flags,char *zVfs)

{
  long lVar1;
  u8 uVar2;
  uint uVar3;
  int iVar4;
  sqlite3 *db_00;
  sqlite3_mutex *psVar5;
  Schema *pSVar6;
  sqlite3 *in_RCX;
  uint in_EDX;
  char *zFormat;
  sqlite3 *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  int i;
  int isThreadsafe;
  int rc;
  sqlite3 *db;
  sqlite3_vfs *in_stack_00000040;
  char *zErrMsg;
  char *zOpen;
  undefined4 in_stack_00000058;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_54;
  uint local_4c;
  undefined4 in_stack_ffffffffffffffdc;
  u8 enc;
  char *zName;
  sqlite3 *db_01;
  uint local_c;
  
  enc = (u8)((uint)in_stack_ffffffffffffffdc >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_01 = (sqlite3 *)0x0;
  zName = (char *)0x0;
  in_RSI->pVfs = (sqlite3_vfs *)0x0;
  uVar3 = sqlite3_initialize();
  if (uVar3 != 0) goto LAB_0014d670;
  if (sqlite3Config.bCoreMutex == '\0') {
    uVar2 = '\0';
  }
  else if ((in_EDX & 0x8000) == 0) {
    uVar2 = sqlite3Config.bFullMutex;
    if ((in_EDX & 0x10000) != 0) {
      uVar2 = '\x01';
    }
  }
  else {
    uVar2 = '\0';
  }
  if ((in_EDX & 0x40000) == 0) {
    local_c = in_EDX;
    if (sqlite3Config.sharedCacheEnabled != 0) {
      local_c = in_EDX | 0x20000;
    }
  }
  else {
    local_c = in_EDX & 0xfffdffff;
  }
  db_00 = (sqlite3 *)
          sqlite3MallocZero(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (db_00 != (sqlite3 *)0x0) {
    if (uVar2 != '\0') {
      psVar5 = sqlite3MutexAlloc(in_stack_ffffffffffffff9c);
      db_00->mutex = psVar5;
      if (db_00->mutex == (sqlite3_mutex *)0x0) {
        sqlite3_free((void *)0x14d10d);
        db_00 = (sqlite3 *)0x0;
        goto LAB_0014d5f8;
      }
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x14d134);
    iVar4 = 0xff;
    if ((local_c & 0x2000000) != 0) {
      iVar4 = -1;
    }
    db_00->errMask = iVar4;
    db_00->nDb = 2;
    db_00->eOpenState = 'm';
    db_00->aDb = db_00->aDbStatic;
    (db_00->lookaside).bDisable = 1;
    (db_00->lookaside).sz = 0;
    memcpy(db_00->aLimit,aHardLimit,0x30);
    db_00->aLimit[0xb] = 0;
    db_00->autoCommit = '\x01';
    db_00->nextAutovac = -1;
    db_00->szMmap = sqlite3Config.szMmap;
    db_00->nextPagesize = 0;
    (db_00->init).azInit = sqlite3StdType;
    db_00->flags = db_00->flags | 0x70e00480e0;
    sqlite3HashInit(&db_00->aCollSeq);
    sqlite3HashInit(&db_00->aModule);
    createCollation(db_01,zName,enc,in_RDI,(_func_int_void_ptr_int_void_ptr_int_void_ptr *)in_RSI,
                    (_func_void_void_ptr *)in_RCX);
    createCollation(db_01,zName,enc,in_RDI,(_func_int_void_ptr_int_void_ptr_int_void_ptr *)in_RSI,
                    (_func_void_void_ptr *)in_RCX);
    createCollation(db_01,zName,enc,in_RDI,(_func_int_void_ptr_int_void_ptr_int_void_ptr *)in_RSI,
                    (_func_void_void_ptr *)in_RCX);
    createCollation(db_01,zName,enc,in_RDI,(_func_int_void_ptr_int_void_ptr_int_void_ptr *)in_RSI,
                    (_func_void_void_ptr *)in_RCX);
    createCollation(db_01,zName,enc,in_RDI,(_func_int_void_ptr_int_void_ptr_int_void_ptr *)in_RSI,
                    (_func_void_void_ptr *)in_RCX);
    if (db_00->mallocFailed == '\0') {
      db_00->openFlags = local_c & 0xfff600e7;
      if ((1 << ((byte)(local_c & 0xfff600e7) & 7) & 0x46U) == 0) {
        local_4c = sqlite3MisuseError(0);
      }
      else {
        local_4c = sqlite3ParseUri((char *)CONCAT44(flags,in_stack_00000058),
                                   (char *)CONCAT44(zOpen._4_4_,zOpen._0_4_),(uint *)zErrMsg,
                                   (sqlite3_vfs **)in_stack_00000040,(char **)zFilename,
                                   (char **)ppDb);
      }
      if (local_4c == 0) {
        iVar4 = sqlite3BtreeOpen(in_stack_00000040,zFilename,(sqlite3 *)ppDb,(Btree **)zVfs,db._4_4_
                                 ,(int)db);
        if (iVar4 == 0) {
          sqlite3BtreeEnter((Btree *)0x14d442);
          pSVar6 = sqlite3SchemaGet((sqlite3 *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                    (Btree *)CONCAT44(in_stack_ffffffffffffff9c,
                                                      in_stack_ffffffffffffff98));
          db_00->aDb->pSchema = pSVar6;
          if (db_00->mallocFailed == '\0') {
            sqlite3SetTextEncoding
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (u8)((uint)in_stack_ffffffffffffff9c >> 0x18));
          }
          sqlite3BtreeLeave((Btree *)0x14d4a1);
          pSVar6 = sqlite3SchemaGet((sqlite3 *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                    (Btree *)CONCAT44(in_stack_ffffffffffffff9c,
                                                      in_stack_ffffffffffffff98));
          db_00->aDb[1].pSchema = pSVar6;
          db_00->aDb->zDbSName = "main";
          db_00->aDb->safety_level = '\x03';
          db_00->aDb[1].zDbSName = "temp";
          db_00->aDb[1].safety_level = '\x01';
          db_00->eOpenState = 'v';
          if (db_00->mallocFailed == '\0') {
            sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
            sqlite3RegisterPerConnectionBuiltinFunctions
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            local_4c = sqlite3_errcode((sqlite3 *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                      );
            for (local_54 = 0; local_4c == 0 && local_54 < 5; local_54 = local_54 + 1) {
              local_4c = (*sqlite3BuiltinExtensions[local_54])(db_00);
            }
            if (local_4c == 0) {
              sqlite3AutoLoadExtensions(in_RCX);
              iVar4 = sqlite3_errcode((sqlite3 *)
                                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
              ;
              if (iVar4 != 0) goto LAB_0014d5f8;
              local_4c = 0;
            }
            if (local_4c != 0) {
              sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
            }
            setupLookaside(in_RSI,in_RCX,(int)((ulong)db_00 >> 0x20),(int)db_00);
            sqlite3_wal_autocheckpoint
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
          }
        }
        else {
          sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
        }
      }
      else {
        if (local_4c == 7) {
          sqlite3OomFault((sqlite3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        }
        zFormat = (char *)0x0;
        if (zName != (char *)0x0) {
          zFormat = "%s";
        }
        sqlite3ErrorWithMsg(db_00,(int)(ulong)local_4c,zFormat,zName);
        sqlite3_free((void *)0x14d3c8);
      }
    }
  }
LAB_0014d5f8:
  if (db_00 != (sqlite3 *)0x0) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x14d60e);
  }
  uVar3 = sqlite3_errcode((sqlite3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((uVar3 & 0xff) == 7) {
    sqlite3_close((sqlite3 *)0x14d634);
    db_00 = (sqlite3 *)0x0;
  }
  else if (uVar3 != 0) {
    db_00->eOpenState = 0xba;
  }
  in_RSI->pVfs = (sqlite3_vfs *)db_00;
  sqlite3_free_filename((char *)0x14d668);
LAB_0014d670:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

static int openDatabase(
  const char *zFilename, /* Database filename UTF-8 encoded */
  sqlite3 **ppDb,        /* OUT: Returned database handle */
  unsigned int flags,    /* Operational flags */
  const char *zVfs       /* Name of the VFS to use */
){
  sqlite3 *db;                    /* Store allocated handle here */
  int rc;                         /* Return code */
  int isThreadsafe;               /* True for threadsafe connections */
  char *zOpen = 0;                /* Filename argument to pass to BtreeOpen() */
  char *zErrMsg = 0;              /* Error message from sqlite3ParseUri() */
  int i;                          /* Loop counter */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif

  if( sqlite3GlobalConfig.bCoreMutex==0 ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_NOMUTEX ){
    isThreadsafe = 0;
  }else if( flags & SQLITE_OPEN_FULLMUTEX ){
    isThreadsafe = 1;
  }else{
    isThreadsafe = sqlite3GlobalConfig.bFullMutex;
  }

  if( flags & SQLITE_OPEN_PRIVATECACHE ){
    flags &= ~SQLITE_OPEN_SHAREDCACHE;
  }else if( sqlite3GlobalConfig.sharedCacheEnabled ){
    flags |= SQLITE_OPEN_SHAREDCACHE;
  }

  /* Remove harmful bits from the flags parameter
  **
  ** The SQLITE_OPEN_NOMUTEX and SQLITE_OPEN_FULLMUTEX flags were
  ** dealt with in the previous code block.  Besides these, the only
  ** valid input flags for sqlite3_open_v2() are SQLITE_OPEN_READONLY,
  ** SQLITE_OPEN_READWRITE, SQLITE_OPEN_CREATE, SQLITE_OPEN_SHAREDCACHE,
  ** SQLITE_OPEN_PRIVATECACHE, SQLITE_OPEN_EXRESCODE, and some reserved
  ** bits.  Silently mask off all other flags.
  */
  flags &=  ~( SQLITE_OPEN_DELETEONCLOSE |
               SQLITE_OPEN_EXCLUSIVE |
               SQLITE_OPEN_MAIN_DB |
               SQLITE_OPEN_TEMP_DB |
               SQLITE_OPEN_TRANSIENT_DB |
               SQLITE_OPEN_MAIN_JOURNAL |
               SQLITE_OPEN_TEMP_JOURNAL |
               SQLITE_OPEN_SUBJOURNAL |
               SQLITE_OPEN_SUPER_JOURNAL |
               SQLITE_OPEN_NOMUTEX |
               SQLITE_OPEN_FULLMUTEX |
               SQLITE_OPEN_WAL
             );

  /* Allocate the sqlite data structure */
  db = sqlite3MallocZero( sizeof(sqlite3) );
  if( db==0 ) goto opendb_out;
  if( isThreadsafe
#ifdef SQLITE_ENABLE_MULTITHREADED_CHECKS
   || sqlite3GlobalConfig.bCoreMutex
#endif
  ){
    db->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_RECURSIVE);
    if( db->mutex==0 ){
      sqlite3_free(db);
      db = 0;
      goto opendb_out;
    }
    if( isThreadsafe==0 ){
      sqlite3MutexWarnOnContention(db->mutex);
    }
  }
  sqlite3_mutex_enter(db->mutex);
  db->errMask = (flags & SQLITE_OPEN_EXRESCODE)!=0 ? 0xffffffff : 0xff;
  db->nDb = 2;
  db->eOpenState = SQLITE_STATE_BUSY;
  db->aDb = db->aDbStatic;
  db->lookaside.bDisable = 1;
  db->lookaside.sz = 0;

  assert( sizeof(db->aLimit)==sizeof(aHardLimit) );
  memcpy(db->aLimit, aHardLimit, sizeof(db->aLimit));
  db->aLimit[SQLITE_LIMIT_WORKER_THREADS] = SQLITE_DEFAULT_WORKER_THREADS;
  db->autoCommit = 1;
  db->nextAutovac = -1;
  db->szMmap = sqlite3GlobalConfig.szMmap;
  db->nextPagesize = 0;
  db->init.azInit = sqlite3StdType; /* Any array of string ptrs will do */
#ifdef SQLITE_ENABLE_SORTER_MMAP
  /* Beginning with version 3.37.0, using the VFS xFetch() API to memory-map
  ** the temporary files used to do external sorts (see code in vdbesort.c)
  ** is disabled. It can still be used either by defining
  ** SQLITE_ENABLE_SORTER_MMAP at compile time or by using the
  ** SQLITE_TESTCTRL_SORTER_MMAP test-control at runtime. */
  db->nMaxSorterMmap = 0x7FFFFFFF;
#endif
  db->flags |= SQLITE_ShortColNames
                 | SQLITE_EnableTrigger
                 | SQLITE_EnableView
                 | SQLITE_CacheSpill
                 | SQLITE_AttachCreate
                 | SQLITE_AttachWrite
                 | SQLITE_Comments
#if !defined(SQLITE_TRUSTED_SCHEMA) || SQLITE_TRUSTED_SCHEMA+0!=0
                 | SQLITE_TrustedSchema
#endif
/* The SQLITE_DQS compile-time option determines the default settings
** for SQLITE_DBCONFIG_DQS_DDL and SQLITE_DBCONFIG_DQS_DML.
**
**    SQLITE_DQS     SQLITE_DBCONFIG_DQS_DDL    SQLITE_DBCONFIG_DQS_DML
**    ----------     -----------------------    -----------------------
**     undefined               on                          on
**         3                   on                          on
**         2                   on                         off
**         1                  off                          on
**         0                  off                         off
**
** Legacy behavior is 3 (double-quoted string literals are allowed anywhere)
** and so that is the default.  But developers are encouraged to use
** -DSQLITE_DQS=0 (best) or -DSQLITE_DQS=1 (second choice) if possible.
*/
#if !defined(SQLITE_DQS)
# define SQLITE_DQS 3
#endif
#if (SQLITE_DQS&1)==1
                 | SQLITE_DqsDML
#endif
#if (SQLITE_DQS&2)==2
                 | SQLITE_DqsDDL
#endif

#if !defined(SQLITE_DEFAULT_AUTOMATIC_INDEX) || SQLITE_DEFAULT_AUTOMATIC_INDEX
                 | SQLITE_AutoIndex
#endif
#if SQLITE_DEFAULT_CKPTFULLFSYNC
                 | SQLITE_CkptFullFSync
#endif
#if SQLITE_DEFAULT_FILE_FORMAT<4
                 | SQLITE_LegacyFileFmt
#endif
#ifdef SQLITE_ENABLE_LOAD_EXTENSION
                 | SQLITE_LoadExtension
#endif
#if SQLITE_DEFAULT_RECURSIVE_TRIGGERS
                 | SQLITE_RecTriggers
#endif
#if defined(SQLITE_DEFAULT_FOREIGN_KEYS) && SQLITE_DEFAULT_FOREIGN_KEYS
                 | SQLITE_ForeignKeys
#endif
#if defined(SQLITE_REVERSE_UNORDERED_SELECTS)
                 | SQLITE_ReverseOrder
#endif
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
                 | SQLITE_CellSizeCk
#endif
#if defined(SQLITE_ENABLE_FTS3_TOKENIZER)
                 | SQLITE_Fts3Tokenizer
#endif
#if defined(SQLITE_ENABLE_QPSG)
                 | SQLITE_EnableQPSG
#endif
#if defined(SQLITE_DEFAULT_DEFENSIVE)
                 | SQLITE_Defensive
#endif
#if defined(SQLITE_DEFAULT_LEGACY_ALTER_TABLE)
                 | SQLITE_LegacyAlter
#endif
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS)
                 | SQLITE_StmtScanStatus
#endif
      ;
  sqlite3HashInit(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3HashInit(&db->aModule);
#endif

  /* Add the default collation sequence BINARY. BINARY works for both UTF-8
  ** and UTF-16, so add a version for each to avoid any unnecessary
  ** conversions. The only error that can occur here is a malloc() failure.
  **
  ** EVIDENCE-OF: R-52786-44878 SQLite defines three built-in collating
  ** functions:
  */
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF8, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16BE, 0, binCollFunc, 0);
  createCollation(db, sqlite3StrBINARY, SQLITE_UTF16LE, 0, binCollFunc, 0);
  createCollation(db, "NOCASE", SQLITE_UTF8, 0, nocaseCollatingFunc, 0);
  createCollation(db, "RTRIM", SQLITE_UTF8, 0, rtrimCollFunc, 0);
  if( db->mallocFailed ){
    goto opendb_out;
  }

#if SQLITE_OS_UNIX && defined(SQLITE_OS_KV_OPTIONAL)
  /* Process magic filenames ":localStorage:" and ":sessionStorage:" */
  if( zFilename && zFilename[0]==':' ){
    if( strcmp(zFilename, ":localStorage:")==0 ){
      zFilename = "file:local?vfs=kvvfs";
      flags |= SQLITE_OPEN_URI;
    }else if( strcmp(zFilename, ":sessionStorage:")==0 ){
      zFilename = "file:session?vfs=kvvfs";
      flags |= SQLITE_OPEN_URI;
    }
  }
#endif /* SQLITE_OS_UNIX && defined(SQLITE_OS_KV_OPTIONAL) */

  /* Parse the filename/URI argument
  **
  ** Only allow sensible combinations of bits in the flags argument.
  ** Throw an error if any non-sense combination is used.  If we
  ** do not block illegal combinations here, it could trigger
  ** assert() statements in deeper layers.  Sensible combinations
  ** are:
  **
  **  1:  SQLITE_OPEN_READONLY
  **  2:  SQLITE_OPEN_READWRITE
  **  6:  SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE
  */
  db->openFlags = flags;
  assert( SQLITE_OPEN_READONLY  == 0x01 );
  assert( SQLITE_OPEN_READWRITE == 0x02 );
  assert( SQLITE_OPEN_CREATE    == 0x04 );
  testcase( (1<<(flags&7))==0x02 ); /* READONLY */
  testcase( (1<<(flags&7))==0x04 ); /* READWRITE */
  testcase( (1<<(flags&7))==0x40 ); /* READWRITE | CREATE */
  if( ((1<<(flags&7)) & 0x46)==0 ){
    rc = SQLITE_MISUSE_BKPT;  /* IMP: R-18321-05872 */
  }else{
    if( zFilename==0 ) zFilename = ":memory:";
    rc = sqlite3ParseUri(zVfs, zFilename, &flags, &db->pVfs, &zOpen, &zErrMsg);
  }
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3ErrorWithMsg(db, rc, zErrMsg ? "%s" : 0, zErrMsg);
    sqlite3_free(zErrMsg);
    goto opendb_out;
  }
  assert( db->pVfs!=0 );
#if SQLITE_OS_KV || defined(SQLITE_OS_KV_OPTIONAL)
  if( sqlite3_stricmp(db->pVfs->zName, "kvvfs")==0 ){
    db->temp_store = 2;
  }
#endif

  /* Open the backend database driver */
  rc = sqlite3BtreeOpen(db->pVfs, zOpen, db, &db->aDb[0].pBt, 0,
                        flags | SQLITE_OPEN_MAIN_DB);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    sqlite3Error(db, rc);
    goto opendb_out;
  }
  sqlite3BtreeEnter(db->aDb[0].pBt);
  db->aDb[0].pSchema = sqlite3SchemaGet(db, db->aDb[0].pBt);
  if( !db->mallocFailed ){
    sqlite3SetTextEncoding(db, SCHEMA_ENC(db));
  }
  sqlite3BtreeLeave(db->aDb[0].pBt);
  db->aDb[1].pSchema = sqlite3SchemaGet(db, 0);

  /* The default safety_level for the main database is FULL; for the temp
  ** database it is OFF. This matches the pager layer defaults.
  */
  db->aDb[0].zDbSName = "main";
  db->aDb[0].safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  db->aDb[1].zDbSName = "temp";
  db->aDb[1].safety_level = PAGER_SYNCHRONOUS_OFF;

  db->eOpenState = SQLITE_STATE_OPEN;
  if( db->mallocFailed ){
    goto opendb_out;
  }

  /* Register all built-in functions, but do not attempt to read the
  ** database schema yet. This is delayed until the first time the database
  ** is accessed.
  */
  sqlite3Error(db, SQLITE_OK);
  sqlite3RegisterPerConnectionBuiltinFunctions(db);
  rc = sqlite3_errcode(db);


  /* Load compiled-in extensions */
  for(i=0; rc==SQLITE_OK && i<ArraySize(sqlite3BuiltinExtensions); i++){
    rc = sqlite3BuiltinExtensions[i](db);
  }

  /* Load automatic extensions - extensions that have been registered
  ** using the sqlite3_automatic_extension() API.
  */
  if( rc==SQLITE_OK ){
    sqlite3AutoLoadExtensions(db);
    rc = sqlite3_errcode(db);
    if( rc!=SQLITE_OK ){
      goto opendb_out;
    }
  }

#ifdef SQLITE_ENABLE_INTERNAL_FUNCTIONS
  /* Testing use only!!! The -DSQLITE_ENABLE_INTERNAL_FUNCTIONS=1 compile-time
  ** option gives access to internal functions by default.
  ** Testing use only!!! */
  db->mDbFlags |= DBFLAG_InternalFunc;
#endif

  /* -DSQLITE_DEFAULT_LOCKING_MODE=1 makes EXCLUSIVE the default locking
  ** mode.  -DSQLITE_DEFAULT_LOCKING_MODE=0 make NORMAL the default locking
  ** mode.  Doing nothing at all also makes NORMAL the default.
  */
#ifdef SQLITE_DEFAULT_LOCKING_MODE
  db->dfltLockMode = SQLITE_DEFAULT_LOCKING_MODE;
  sqlite3PagerLockingMode(sqlite3BtreePager(db->aDb[0].pBt),
                          SQLITE_DEFAULT_LOCKING_MODE);
#endif

  if( rc ) sqlite3Error(db, rc);

  /* Enable the lookaside-malloc subsystem */
  setupLookaside(db, 0, sqlite3GlobalConfig.szLookaside,
                        sqlite3GlobalConfig.nLookaside);

  sqlite3_wal_autocheckpoint(db, SQLITE_DEFAULT_WAL_AUTOCHECKPOINT);

opendb_out:
  if( db ){
    assert( db->mutex!=0 || isThreadsafe==0
           || sqlite3GlobalConfig.bFullMutex==0 );
    sqlite3_mutex_leave(db->mutex);
  }
  rc = sqlite3_errcode(db);
  assert( db!=0 || (rc&0xff)==SQLITE_NOMEM );
  if( (rc&0xff)==SQLITE_NOMEM ){
    sqlite3_close(db);
    db = 0;
  }else if( rc!=SQLITE_OK ){
    db->eOpenState = SQLITE_STATE_SICK;
  }
  *ppDb = db;
#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Opening a db handle. Fourth parameter is passed 0. */
    void *pArg = sqlite3GlobalConfig.pSqllogArg;
    sqlite3GlobalConfig.xSqllog(pArg, db, zFilename, 0);
  }
#endif
  sqlite3_free_filename(zOpen);
  return rc;
}